

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_neg(secp256k1_ge *r,secp256k1_ge *a)

{
  secp256k1_fe *r_00;
  long lVar1;
  secp256k1_ge *psVar2;
  byte bVar3;
  
  bVar3 = 0;
  secp256k1_ge_verify(a);
  psVar2 = r;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    (psVar2->x).n[0] = (a->x).n[0];
    a = (secp256k1_ge *)((long)a + (ulong)bVar3 * -0x10 + 8);
    psVar2 = (secp256k1_ge *)((long)psVar2 + (ulong)bVar3 * -0x10 + 8);
  }
  r_00 = &r->y;
  secp256k1_fe_normalize_weak(r_00);
  secp256k1_fe_negate_unchecked(r_00,r_00,1);
  secp256k1_ge_verify(r);
  return;
}

Assistant:

static void secp256k1_ge_neg(secp256k1_ge *r, const secp256k1_ge *a) {
    SECP256K1_GE_VERIFY(a);

    *r = *a;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);

    SECP256K1_GE_VERIFY(r);
}